

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::parameterTypeCheck
          (TParseContext *this,TSourceLoc *loc,TStorageQualifier qualifier,TType *type)

{
  TSourceLoc *pTVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  TString local_c8;
  TString local_a0;
  TString local_78;
  TString local_50;
  TType *local_28;
  TType *type_local;
  TSourceLoc *pTStack_18;
  TStorageQualifier qualifier_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  local_28 = type;
  type_local._4_4_ = qualifier;
  pTStack_18 = loc;
  loc_local = (TSourceLoc *)this;
  if ((((qualifier == EvqOut) || (qualifier == EvqInOut)) &&
      (uVar3 = (*type->_vptr_TType[0x28])(), (uVar3 & 1) != 0)) &&
     (bVar2 = TIntermediate::getBindlessMode
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate),
     pTVar1 = pTStack_18, !bVar2)) {
    TType::getBasicTypeString_abi_cxx11_(&local_50,local_28);
    pcVar4 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       (&local_50);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar1,"samplers and atomic_uints cannot be output parameters",pcVar4,"");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_50);
  }
  if ((((this->super_TParseContextBase).parsingBuiltins & 1U) == 0) &&
     (bVar2 = TType::contains16BitFloat(local_28), pTVar1 = pTStack_18, bVar2)) {
    TType::getBasicTypeString_abi_cxx11_(&local_78,local_28);
    pcVar4 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       (&local_78);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x15])
              (this,pTVar1,pcVar4,"float16 types can only be in uniform block or buffer storage");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_78);
  }
  if ((((this->super_TParseContextBase).parsingBuiltins & 1U) == 0) &&
     (bVar2 = TType::contains16BitInt(local_28), pTVar1 = pTStack_18, bVar2)) {
    TType::getBasicTypeString_abi_cxx11_(&local_a0,local_28);
    pcVar4 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       (&local_a0);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x18])
              (this,pTVar1,pcVar4,"(u)int16 types can only be in uniform block or buffer storage");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_a0);
  }
  if ((((this->super_TParseContextBase).parsingBuiltins & 1U) == 0) &&
     (bVar2 = TType::contains8BitInt(local_28), pTVar1 = pTStack_18, bVar2)) {
    TType::getBasicTypeString_abi_cxx11_(&local_c8,local_28);
    pcVar4 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       (&local_c8);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1b])
              (this,pTVar1,pcVar4,"(u)int8 types can only be in uniform block or buffer storage");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_c8);
  }
  return;
}

Assistant:

void TParseContext::parameterTypeCheck(const TSourceLoc& loc, TStorageQualifier qualifier, const TType& type)
{
    if ((qualifier == EvqOut || qualifier == EvqInOut) && type.isOpaque() && !intermediate.getBindlessMode())
        error(loc, "samplers and atomic_uints cannot be output parameters", type.getBasicTypeString().c_str(), "");
    if (!parsingBuiltins && type.contains16BitFloat())
        requireFloat16Arithmetic(loc, type.getBasicTypeString().c_str(), "float16 types can only be in uniform block or buffer storage");
    if (!parsingBuiltins && type.contains16BitInt())
        requireInt16Arithmetic(loc, type.getBasicTypeString().c_str(), "(u)int16 types can only be in uniform block or buffer storage");
    if (!parsingBuiltins && type.contains8BitInt())
        requireInt8Arithmetic(loc, type.getBasicTypeString().c_str(), "(u)int8 types can only be in uniform block or buffer storage");
}